

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double duckdb::TryCastCInternal<bool,double,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  double result_value;
  undefined2 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffca;
  undefined1 in_stack_ffffffffffffffcb;
  undefined4 in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined8 local_28;
  undefined8 local_8;
  
  bVar1 = UnsafeFetch<bool>((duckdb_result *)
                            CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                            CONCAT44(in_stack_ffffffffffffffcc,
                                     CONCAT13(in_stack_ffffffffffffffcb,
                                              CONCAT12(in_stack_ffffffffffffffca,
                                                       in_stack_ffffffffffffffc8))),0x1947177);
  bVar1 = TryCast::Operation<bool,double>
                    ((bool)in_stack_ffffffffffffffd7,
                     (double *)
                     CONCAT44(in_stack_ffffffffffffffcc,
                              CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffffca,
                                                      in_stack_ffffffffffffffc8))),false);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    local_8 = FetchDefaultValue::Operation<double>();
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}